

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# marray.cxx
# Opt level: O2

void __thiscall ViewTest::shapeConstructorTest<true>(ViewTest *this)

{
  size_t sVar1;
  reference piVar2;
  size_t j;
  ulong uVar3;
  ulong uVar4;
  ulong args_1;
  int *data;
  size_t k_1;
  size_t j_4;
  size_t j_2;
  allocator_type local_89;
  vector<unsigned_long,_std::allocator<unsigned_long>_> shape;
  View<int,_true,_std::allocator<unsigned_long>_> v;
  
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector(&shape,1,(allocator_type *)&v);
  *shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
   super__Vector_impl_data._M_start = 0x18;
  data = this->data_;
  andres::View<int,true,std::allocator<unsigned_long>>::
  View<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
            ((View<int,true,std::allocator<unsigned_long>> *)&v,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_start,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_finish,data,&andres::defaultOrder,&andres::defaultOrder,
             &local_89);
  sVar1 = andres::View<int,_true,_std::allocator<unsigned_long>_>::dimension(&v);
  local_89 = (allocator_type)
             (v.geometry_.size_ == 0x18 &&
             sVar1 == (long)shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                            _M_impl.super__Vector_impl_data._M_finish -
                      (long)shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                            _M_impl.super__Vector_impl_data._M_start >> 3);
  test((bool *)&local_89);
  for (uVar3 = 0; uVar3 = uVar3 & 0xffff,
      uVar3 < (ulong)((long)shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                            _M_impl.super__Vector_impl_data._M_finish -
                      (long)shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                            _M_impl.super__Vector_impl_data._M_start >> 3);
      uVar3 = (ulong)((int)uVar3 + 1)) {
    sVar1 = andres::View<int,_true,_std::allocator<unsigned_long>_>::shape(&v,uVar3);
    local_89 = (allocator_type)
               (sVar1 == shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                         _M_impl.super__Vector_impl_data._M_start[uVar3]);
    test((bool *)&local_89);
  }
  for (uVar3 = 0; uVar3 < v.geometry_.size_; uVar3 = uVar3 + 1) {
    piVar2 = andres::View<int,_true,_std::allocator<unsigned_long>_>::operator()(&v,uVar3);
    local_89 = (allocator_type)(*piVar2 == data[uVar3]);
    test((bool *)&local_89);
  }
  andres::marray_detail::Geometry<std::allocator<unsigned_long>_>::~Geometry(&v.geometry_);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            (&shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector(&shape,2,(allocator_type *)&v);
  *shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
   super__Vector_impl_data._M_start = 6;
  shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start[1] = 4;
  andres::View<int,true,std::allocator<unsigned_long>>::
  View<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
            ((View<int,true,std::allocator<unsigned_long>> *)&v,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_start,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_finish,data,&andres::defaultOrder,&andres::defaultOrder,
             &local_89);
  sVar1 = andres::View<int,_true,_std::allocator<unsigned_long>_>::dimension(&v);
  local_89 = (allocator_type)
             (v.geometry_.size_ == 0x18 &&
             sVar1 == (long)shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                            _M_impl.super__Vector_impl_data._M_finish -
                      (long)shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                            _M_impl.super__Vector_impl_data._M_start >> 3);
  test((bool *)&local_89);
  for (uVar3 = 0; uVar3 = uVar3 & 0xffff,
      uVar3 < (ulong)((long)shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                            _M_impl.super__Vector_impl_data._M_finish -
                      (long)shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                            _M_impl.super__Vector_impl_data._M_start >> 3);
      uVar3 = (ulong)((int)uVar3 + 1)) {
    sVar1 = andres::View<int,_true,_std::allocator<unsigned_long>_>::shape(&v,uVar3);
    local_89 = (allocator_type)
               (sVar1 == shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                         _M_impl.super__Vector_impl_data._M_start[uVar3]);
    test((bool *)&local_89);
  }
  for (uVar3 = 0; uVar3 < v.geometry_.size_; uVar3 = uVar3 + 1) {
    piVar2 = andres::View<int,_true,_std::allocator<unsigned_long>_>::operator()(&v,uVar3);
    local_89 = (allocator_type)(*piVar2 == data[uVar3]);
    test((bool *)&local_89);
  }
  uVar3 = 0;
  while( true ) {
    sVar1 = andres::View<int,_true,_std::allocator<unsigned_long>_>::shape(&v,0);
    if (sVar1 <= uVar3) break;
    uVar4 = 0;
    while( true ) {
      sVar1 = andres::View<int,_true,_std::allocator<unsigned_long>_>::shape(&v,1);
      if (sVar1 <= uVar4) break;
      piVar2 = andres::View<int,true,std::allocator<unsigned_long>>::operator()
                         ((View<int,true,std::allocator<unsigned_long>> *)&v,uVar3,uVar4);
      local_89 = (allocator_type)
                 (*piVar2 ==
                 data[*shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                       _M_impl.super__Vector_impl_data._M_start * uVar4 + uVar3]);
      test((bool *)&local_89);
      uVar4 = uVar4 + 1;
    }
    uVar3 = uVar3 + 1;
  }
  andres::marray_detail::Geometry<std::allocator<unsigned_long>_>::~Geometry(&v.geometry_);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            (&shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector(&shape,3,(allocator_type *)&v);
  *shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
   super__Vector_impl_data._M_start = 2;
  shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start[1] = 4;
  shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start[2] = 3;
  andres::View<int,true,std::allocator<unsigned_long>>::
  View<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
            ((View<int,true,std::allocator<unsigned_long>> *)&v,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_start,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_finish,data,&andres::defaultOrder,&andres::defaultOrder,
             &local_89);
  sVar1 = andres::View<int,_true,_std::allocator<unsigned_long>_>::dimension(&v);
  local_89 = (allocator_type)
             (v.geometry_.size_ == 0x18 &&
             sVar1 == (long)shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                            _M_impl.super__Vector_impl_data._M_finish -
                      (long)shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                            _M_impl.super__Vector_impl_data._M_start >> 3);
  test((bool *)&local_89);
  for (uVar3 = 0; uVar3 = uVar3 & 0xffff,
      uVar3 < (ulong)((long)shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                            _M_impl.super__Vector_impl_data._M_finish -
                      (long)shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                            _M_impl.super__Vector_impl_data._M_start >> 3);
      uVar3 = (ulong)((int)uVar3 + 1)) {
    sVar1 = andres::View<int,_true,_std::allocator<unsigned_long>_>::shape(&v,uVar3);
    local_89 = (allocator_type)
               (sVar1 == shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                         _M_impl.super__Vector_impl_data._M_start[uVar3]);
    test((bool *)&local_89);
  }
  for (uVar3 = 0; uVar3 < v.geometry_.size_; uVar3 = uVar3 + 1) {
    piVar2 = andres::View<int,_true,_std::allocator<unsigned_long>_>::operator()(&v,uVar3);
    local_89 = (allocator_type)(*piVar2 == data[uVar3]);
    test((bool *)&local_89);
  }
  uVar3 = 0;
  while( true ) {
    sVar1 = andres::View<int,_true,_std::allocator<unsigned_long>_>::shape(&v,0);
    if (sVar1 <= uVar3) break;
    uVar4 = 0;
    while( true ) {
      sVar1 = andres::View<int,_true,_std::allocator<unsigned_long>_>::shape(&v,1);
      if (sVar1 <= uVar4) break;
      args_1 = 0;
      while( true ) {
        sVar1 = andres::View<int,_true,_std::allocator<unsigned_long>_>::shape(&v,2);
        if (sVar1 <= args_1) break;
        piVar2 = andres::View<int,true,std::allocator<unsigned_long>>::operator()
                           ((View<int,true,std::allocator<unsigned_long>> *)&v,uVar3,uVar4,args_1);
        local_89 = (allocator_type)
                   (*piVar2 ==
                   data[(shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                         _M_impl.super__Vector_impl_data._M_start[1] * args_1 + uVar4) *
                        *shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                         _M_impl.super__Vector_impl_data._M_start + uVar3]);
        test((bool *)&local_89);
        args_1 = args_1 + 1;
      }
      uVar4 = uVar4 + 1;
    }
    uVar3 = uVar3 + 1;
  }
  andres::marray_detail::Geometry<std::allocator<unsigned_long>_>::~Geometry(&v.geometry_);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            (&shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
  return;
}

Assistant:

void ViewTest::shapeConstructorTest() {
    // 1D
    {
        std::vector<std::size_t> shape(1);
        shape[0] = 24;
        andres::View<int, constTarget> v(shape.begin(), shape.end(), data_);
        
        test(v.dimension() == shape.size() &&
               v.size() == 24
        );
        for(unsigned short j=0; j<shape.size(); ++j) {
            test(v.shape(j) == shape[j]);
        }
        for(std::size_t j=0; j<v.size(); ++j) {
            test(v(j) == data_[j]);
        }
    }
    // 2D
    {
        std::vector<std::size_t> shape(2);
        shape[0] = 6;
        shape[1] = 4;
        andres::View<int, constTarget> v(shape.begin(), shape.end(), data_);
        
        test(v.dimension() == shape.size() &&
               v.size() == 24
        );
        for(unsigned short j=0; j<shape.size(); ++j) {
            test(v.shape(j) == shape[j]);
        }
        for(std::size_t j=0; j<v.size(); ++j) {
            test(v(j) == data_[j]);
        }
        for(std::size_t j=0; j<v.shape(0); ++j) {
            for(std::size_t k=0; k<v.shape(1); ++k) {
                test(v(j, k) == data_[j+k*shape[0]]);
            }
        }
    }
    // 3D
    {
        std::vector<std::size_t> shape(3);
        shape[0] = 2;
        shape[1] = 4;
        shape[2] = 3;
        andres::View<int, constTarget> v(shape.begin(), shape.end(), data_);
        
        test(v.dimension() == shape.size() &&
               v.size() == 24
        );
        for(unsigned short j=0; j<shape.size(); ++j) {
            test(v.shape(j) == shape[j]);
        }
        for(std::size_t j=0; j<v.size(); ++j) {
            test(v(j) == data_[j]);
        }
        for(std::size_t j=0; j<v.shape(0); ++j) {
            for(std::size_t k=0; k<v.shape(1); ++k) {
                for(std::size_t p=0; p<v.shape(2); ++p) {
                    test(v(j, k, p) == data_[ j + k*shape[0] + p*shape[0]*shape[1] ]);
                }
            }
        }
    }
}